

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

LY_ERR ly_path_parse(ly_ctx *ctx,lysc_node *ctx_node,char *str_path,size_t path_len,ly_bool lref,
                    uint16_t begin,uint16_t prefix,uint16_t pred,lyxp_expr **expr)

{
  uint uVar1;
  lyxp_expr *exp;
  ushort uVar2;
  uint16_t uVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  int iVar7;
  lyxp_expr_type **pplVar8;
  char *pcVar9;
  undefined8 uVar10;
  char *pcVar11;
  ulong uVar12;
  char *s;
  uint32_t tok_idx;
  uint32_t local_64;
  lyxp_expr *local_60;
  char *local_58;
  lysc_node *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_60 = (lyxp_expr *)0x0;
  if (1 < (ushort)(begin - 1)) {
    __assert_fail("(begin == LY_PATH_BEGIN_ABSOLUTE) || (begin == LY_PATH_BEGIN_EITHER)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x14d,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  uVar2 = prefix << 0xc | (ushort)(prefix - 0x10) >> 4;
  if ((7 < uVar2) || ((0x8bU >> (uVar2 & 0x1f) & 1) == 0)) {
    __assert_fail("(prefix == LY_PATH_PREFIX_OPTIONAL) || (prefix == LY_PATH_PREFIX_MANDATORY) || (prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x14f,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  local_44 = (uint)pred;
  if (((pred != 0x100) && (pred != 0x200)) && (local_44 != 0x400)) {
    __assert_fail("(pred == LY_PATH_PRED_KEYS) || (pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_LEAFREF)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x150,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  if (ctx_node != (lysc_node *)0x0) {
    ly_log_location(ctx_node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  local_50 = ctx_node;
  LVar4 = lyxp_expr_parse(ctx,str_path,path_len,'\0',&local_60);
  exp = local_60;
  if (LVar4 == LY_SUCCESS) {
    local_64 = 0;
    pplVar8 = (lyxp_expr_type **)calloc((ulong)local_60->size,8);
    exp->repeat = pplVar8;
    if (pplVar8 == (lyxp_expr_type **)0x0) {
      LVar4 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_parse");
    }
    else if (begin == 2) {
      uVar10 = 0;
      LVar4 = lyxp_next_token((ly_ctx *)0x0,exp,&local_64,LYXP_TOKEN_OPER_PATH);
      if (LVar4 == LY_SUCCESS) {
LAB_00113028:
        local_38 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
      }
      else {
        if (lref != '\0') {
          uVar3 = ly_ctx_get_options(ctx);
          if (((uVar3 >> 9 & 1) != 0) &&
             (LVar4 = lyxp_check_token((ly_ctx *)0x0,local_60,local_64,LYXP_TOKEN_FUNCNAME),
             LVar4 == LY_SUCCESS)) {
            LVar5 = ly_path_parse_deref(ctx,local_50,local_60,&local_64);
            LVar4 = LY_EVALID;
            if ((LVar5 != LY_SUCCESS) ||
               (LVar5 = lyxp_next_token(ctx,local_60,&local_64,LYXP_TOKEN_OPER_PATH),
               LVar5 != LY_SUCCESS)) goto LAB_00112ec5;
          }
          LVar5 = lyxp_next_token(ctx,local_60,&local_64,LYXP_TOKEN_DDOT);
          LVar4 = LY_EVALID;
          if (LVar5 != LY_SUCCESS) goto LAB_00112ec5;
          do {
            LVar5 = lyxp_next_token(ctx,local_60,&local_64,LYXP_TOKEN_OPER_PATH);
            if (LVar5 != LY_SUCCESS) goto LAB_00112ec5;
            LVar5 = lyxp_next_token((ly_ctx *)0x0,local_60,&local_64,LYXP_TOKEN_DDOT);
          } while (LVar5 == LY_SUCCESS);
        }
        local_38 = 0;
      }
      local_58 = (char *)0x0;
      local_38 = local_38 ^ 1;
      LVar5 = LY_EVALID;
      do {
        LVar6 = lyxp_check_token(ctx,local_60,local_64,LYXP_TOKEN_NAMETEST);
        LVar4 = LVar5;
        if (LVar6 != LY_SUCCESS) goto LAB_00112ec5;
        s = local_60->expr + local_60->tok_pos[local_64];
        uVar1 = local_60->tok_len[local_64];
        uVar12 = (ulong)uVar1;
        pcVar11 = local_58;
        if ((prefix == 0x80) || (prefix == 0x40)) {
          if (local_58 == (char *)0x0 && (char)local_38 == '\0') {
            pcVar9 = strnstr(s,":",uVar12);
            pcVar11 = s;
            goto joined_r0x001130e0;
          }
          if (((prefix == 0x80) && (local_58 != (char *)0x0)) &&
             (local_40 = uVar12, pcVar9 = strnstr(s,":",uVar12), pcVar11 = local_58,
             pcVar9 != (char *)0x0)) {
            iVar7 = strncmp(local_58,s,(long)pcVar9 - (long)s);
            pcVar11 = s;
            if ((iVar7 != 0) || (local_58[(long)pcVar9 - (long)s] != ':')) goto LAB_001130eb;
            pcVar11 = "Duplicate prefix for \"%.*s\" in path.";
            uVar12 = local_40;
            goto LAB_001131f1;
          }
        }
        else {
          if (prefix != 0x20) goto LAB_001130eb;
          pcVar9 = strnstr(s,":",uVar12);
          pcVar11 = local_58;
joined_r0x001130e0:
          if (pcVar9 == (char *)0x0) {
            pcVar11 = "Prefix missing for \"%.*s\" in path.";
            uVar12 = (ulong)uVar1;
LAB_001131f1:
            ly_vlog(ctx,(char *)0x0,LYVE_XPATH,pcVar11,uVar12,s);
            goto LAB_00112ec5;
          }
        }
LAB_001130eb:
        local_58 = pcVar11;
        local_64 = local_64 + 1;
        LVar4 = ly_path_check_predicate(ctx,local_50,local_60,&local_64,prefix,(uint16_t)local_44);
        if (LVar4 != LY_SUCCESS) goto LAB_00112ec5;
        LVar4 = lyxp_next_token((ly_ctx *)0x0,local_60,&local_64,LYXP_TOKEN_OPER_PATH);
      } while (LVar4 == LY_SUCCESS);
      if (local_60->used <= local_64) {
        *expr = local_60;
        LVar4 = LY_SUCCESS;
        goto LAB_00112ed2;
      }
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unparsed characters \"%s\" left at the end of path.",
              local_60->expr + local_60->tok_pos[local_64]);
      LVar4 = LVar5;
    }
    else {
      uVar10 = 0;
      LVar5 = lyxp_next_token(ctx,exp,&local_64,LYXP_TOKEN_OPER_PATH);
      LVar4 = LY_EVALID;
      if (LVar5 == LY_SUCCESS) goto LAB_00113028;
    }
  }
LAB_00112ec5:
  lyxp_expr_free(ctx,local_60);
LAB_00112ed2:
  ly_log_location_revert((uint)(local_50 != (lysc_node *)0x0),0,0,0);
  return LVar4;
}

Assistant:

LY_ERR
ly_path_parse(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *str_path, size_t path_len,
        ly_bool lref, uint16_t begin, uint16_t prefix, uint16_t pred, struct lyxp_expr **expr)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *exp = NULL;
    uint32_t tok_idx, cur_len;
    const char *cur_node, *prev_prefix = NULL, *ptr;
    ly_bool is_abs;

    assert((begin == LY_PATH_BEGIN_ABSOLUTE) || (begin == LY_PATH_BEGIN_EITHER));
    assert((prefix == LY_PATH_PREFIX_OPTIONAL) || (prefix == LY_PATH_PREFIX_MANDATORY) ||
            (prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT));
    assert((pred == LY_PATH_PRED_KEYS) || (pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_LEAFREF));

    if (ctx_node) {
        LOG_LOCSET(ctx_node, NULL);
    }

    /* parse as a generic XPath expression, reparse is performed manually */
    LY_CHECK_GOTO(ret = lyxp_expr_parse(ctx, str_path, path_len, 0, &exp), error);
    tok_idx = 0;

    /* alloc empty repeat (only '=', filled manually) */
    exp->repeat = calloc(exp->size, sizeof *exp->repeat);
    LY_CHECK_ERR_GOTO(!exp->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

    if (begin == LY_PATH_BEGIN_EITHER) {
        /* is the path relative? */
        if (lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_OPER_PATH)) {
            /* relative path check specific to leafref */
            if (lref) {
                /* optional function 'deref..' */
                if ((ly_ctx_get_options(ctx) & LY_CTX_LEAFREF_EXTENDED) &&
                        !lyxp_check_token(NULL, exp, tok_idx, LYXP_TOKEN_FUNCNAME)) {
                    LY_CHECK_ERR_GOTO(ly_path_parse_deref(ctx, ctx_node, exp, &tok_idx), ret = LY_EVALID, error);

                    /* '/' */
                    LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID,
                            error);
                }

                /* mandatory '..' */
                LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_DDOT), ret = LY_EVALID, error);

                do {
                    /* '/' */
                    LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID,
                            error);

                    /* optional '..' */
                } while (!lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_DDOT));
            }

            is_abs = 0;
        } else {
            is_abs = 1;
        }
    } else {
        /* '/' */
        LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID, error);

        is_abs = 1;
    }

    do {
        /* NameTest */
        LY_CHECK_ERR_GOTO(lyxp_check_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), ret = LY_EVALID, error);

        /* check prefix based on the options */
        cur_node = exp->expr + exp->tok_pos[tok_idx];
        cur_len = exp->tok_len[tok_idx];
        if (prefix == LY_PATH_PREFIX_MANDATORY) {
            if (!strnstr(cur_node, ":", cur_len)) {
                LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)cur_len, cur_node);
                ret = LY_EVALID;
                goto error;
            }
        } else if ((prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT)) {
            if (!prev_prefix && is_abs) {
                /* the first node must have a prefix */
                if (!strnstr(cur_node, ":", cur_len)) {
                    LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)cur_len, cur_node);
                    ret = LY_EVALID;
                    goto error;
                }

                /* remember the first prefix */
                prev_prefix = cur_node;
            } else if (prev_prefix && (prefix == LY_PATH_PREFIX_STRICT_INHERIT)) {
                /* the prefix must be different, if any */
                ptr = strnstr(cur_node, ":", cur_len);
                if (ptr) {
                    if (!strncmp(prev_prefix, cur_node, ptr - cur_node) && (prev_prefix[ptr - cur_node] == ':')) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate prefix for \"%.*s\" in path.", (int)cur_len, cur_node);
                        ret = LY_EVALID;
                        goto error;
                    }

                    /* remember this next prefix */
                    prev_prefix = cur_node;
                }
            }
        }

        ++tok_idx;

        /* Predicate* */
        LY_CHECK_GOTO(ret = ly_path_check_predicate(ctx, ctx_node, exp, &tok_idx, prefix, pred), error);

        /* '/' */
    } while (!lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_OPER_PATH));

    /* trailing token check */
    if (exp->used > tok_idx) {
        LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of path.", exp->expr + exp->tok_pos[tok_idx]);
        ret = LY_EVALID;
        goto error;
    }

    *expr = exp;

    LOG_LOCBACK(ctx_node ? 1 : 0, 0);
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, exp);
    LOG_LOCBACK(ctx_node ? 1 : 0, 0);
    return ret;
}